

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast.cpp
# Opt level: O3

short duckdb::DecimalScaleUpOperator::Operation<long,short>
                (long input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  bool bVar1;
  undefined1 auVar2 [16];
  short result;
  short local_3a;
  string local_38;
  
  bVar1 = TryCast::Operation<long,short>(input,&local_3a,false);
  if (bVar1) {
    return local_3a * *(short *)((long)dataptr + 0x28);
  }
  auVar2 = __cxa_allocate_exception(0x10);
  CastExceptionText<long,short>(&local_38,(duckdb *)input,auVar2._8_8_);
  InvalidInputException::InvalidInputException(auVar2._0_8_,&local_38);
  __cxa_throw(auVar2._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		auto data = (DecimalScaleInput<INPUT_TYPE, RESULT_TYPE> *)dataptr;
		return Cast::Operation<INPUT_TYPE, RESULT_TYPE>(input) * data->factor;
	}